

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civetweb.c
# Opt level: O3

int mg_get_server_ports(mg_context *ctx,int size,mg_server_port *ports)

{
  ushort uVar1;
  short sVar2;
  undefined4 uVar3;
  socket *psVar4;
  undefined1 auVar5 [13];
  undefined1 auVar6 [13];
  undefined1 auVar7 [13];
  undefined1 auVar8 [13];
  ulong uVar9;
  undefined1 auVar10 [13];
  ulong uVar11;
  ulong uVar12;
  int iVar13;
  int iVar14;
  
  iVar13 = -1;
  if (0 < size) {
    memset(ports,0,(ulong)(uint)size << 5);
    if ((ctx != (mg_context *)0x0) && (psVar4 = ctx->listening_sockets, psVar4 != (socket *)0x0)) {
      uVar12 = 0;
      uVar11 = (ulong)ctx->num_listening_sockets;
      if ((int)ctx->num_listening_sockets < 1) {
        uVar11 = uVar12;
      }
      iVar13 = 0;
      do {
        if (uVar11 * 0x40 == uVar12) {
          return iVar13;
        }
        uVar1 = *(ushort *)((long)&psVar4->lsa + uVar12 + 2);
        ports[iVar13].port = (uint)(ushort)(uVar1 << 8 | uVar1 >> 8);
        uVar3 = *(undefined4 *)(&psVar4->is_ssl + uVar12);
        uVar9 = (ulong)(ushort)uVar3 & 0xffffffffffff00ff;
        auVar5._8_4_ = 0;
        auVar5._0_8_ = uVar9;
        auVar5[0xc] = (char)((uint)uVar3 >> 0x18);
        auVar6[8] = (char)((uint)uVar3 >> 0x10);
        auVar6._0_8_ = uVar9;
        auVar6[9] = 0;
        auVar6._10_3_ = auVar5._10_3_;
        auVar10._5_8_ = 0;
        auVar10._0_5_ = auVar6._8_5_;
        auVar7[4] = (char)((uint)uVar3 >> 8);
        auVar7._0_4_ = (int)uVar9;
        auVar7[5] = 0;
        auVar7._6_7_ = SUB137(auVar10 << 0x40,6);
        auVar8._4_9_ = auVar7._4_9_;
        auVar8._0_4_ = (int)uVar9;
        ports[iVar13].is_ssl = (int)auVar8._0_8_;
        ports[iVar13].is_redirect = (int)((ulong)auVar8._0_8_ >> 0x20);
        sVar2 = *(short *)((long)&psVar4->lsa + uVar12);
        if (sVar2 == 2) {
          iVar14 = 1;
LAB_0010ba95:
          ports[iVar13].protocol = iVar14;
          iVar13 = iVar13 + 1;
        }
        else if (sVar2 == 10) {
          iVar14 = 3;
          goto LAB_0010ba95;
        }
        uVar12 = uVar12 + 0x40;
      } while ((ulong)(uint)size << 6 != uVar12);
    }
  }
  return iVar13;
}

Assistant:

CIVETWEB_API int
mg_get_server_ports(const struct mg_context *ctx,
                    int size,
                    struct mg_server_port *ports)
{
	int i, cnt = 0;

	if (size <= 0) {
		return -1;
	}
	memset(ports, 0, sizeof(*ports) * (size_t)size);
	if (!ctx) {
		return -1;
	}
	if (!ctx->listening_sockets) {
		return -1;
	}

	for (i = 0; (i < size) && (i < (int)ctx->num_listening_sockets); i++) {

		ports[cnt].port =
		    ntohs(USA_IN_PORT_UNSAFE(&(ctx->listening_sockets[i].lsa)));
		ports[cnt].is_ssl = ctx->listening_sockets[i].is_ssl;
		ports[cnt].is_redirect = ctx->listening_sockets[i].ssl_redir;

		if (ctx->listening_sockets[i].lsa.sa.sa_family == AF_INET) {
			/* IPv4 */
			ports[cnt].protocol = 1;
			cnt++;
		} else if (ctx->listening_sockets[i].lsa.sa.sa_family == AF_INET6) {
			/* IPv6 */
			ports[cnt].protocol = 3;
			cnt++;
		}
	}

	return cnt;
}